

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O2

Vector3d * __thiscall
OpenMD::StuntDouble::body2Lab(Vector3d *__return_storage_ptr__,StuntDouble *this,Vector3d *v)

{
  Vector<double,_3U> VStack_c8;
  RotMat3x3d local_b0;
  RectMatrix<double,_3U,_3U> local_68;
  
  getA(&local_b0,this);
  SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_68,&local_b0);
  operator*(&VStack_c8,&local_68,&v->super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&__return_storage_ptr__->super_Vector<double,_3U>,&VStack_c8);
  return __return_storage_ptr__;
}

Assistant:

Vector3d body2Lab(const Vector3d& v) { return getA().transpose() * v; }